

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
__thiscall wabt::MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>(wabt *this,Location *args)

{
  DataSegmentModuleField *this_00;
  
  this_00 = (DataSegmentModuleField *)operator_new(0xe0);
  DataSegmentModuleField::DataSegmentModuleField(this_00,args,(string_view)ZEXT816(0));
  *(DataSegmentModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}